

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O3

void __thiscall wasm::SubTypes::getSubTypesFirstSort()::HeapType_(void *this,HeapType type)

{
  pointer pHVar1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar2;
  pointer pHVar3;
  
  pvVar2 = getStrictSubTypes(*(SubTypes **)((long)this + 0x50),type);
  pHVar1 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pHVar3 = (pvVar2->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                _M_impl.super__Vector_impl_data._M_start; pHVar3 != pHVar1; pHVar3 = pHVar3 + 1) {
    TopologicalSort<wasm::HeapType,_SubTypesFirstSort>::push
              ((TopologicalSort<wasm::HeapType,_SubTypesFirstSort> *)this,(HeapType)pHVar3->id);
  }
  return;
}

Assistant:

void pushPredecessors(HeapType type) {
        // Things we need to process before each type are its subtypes. Once we
        // know their depth, we can easily compute our own.
        for (auto pred : parent.getStrictSubTypes(type)) {
          push(pred);
        }
      }